

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-oid.c
# Opt level: O2

void bson_oid_init_from_string(bson_oid_t *oid,char *str)

{
  uint8_t uVar1;
  byte bVar2;
  undefined8 uVar3;
  char *pcVar4;
  int i;
  long lVar5;
  
  if (oid == (bson_oid_t *)0x0) {
    pcVar4 = "oid";
    uVar3 = 0xe9;
  }
  else {
    if (str != (char *)0x0) {
      for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
        uVar1 = bson_oid_parse_hex_char(str[lVar5 * 2]);
        bVar2 = bson_oid_parse_hex_char(str[lVar5 * 2 + 1]);
        oid->bytes[lVar5] = bVar2 | uVar1 << 4;
      }
      return;
    }
    pcVar4 = "str";
    uVar3 = 0xea;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-oid.c",
          uVar3,"bson_oid_init_from_string",pcVar4);
  abort();
}

Assistant:

void
bson_oid_init_from_string (bson_oid_t *oid, /* OUT */
                           const char *str) /* IN */
{
   BSON_ASSERT (oid);
   BSON_ASSERT (str);

   bson_oid_init_from_string_unsafe (oid, str);
}